

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_beginend.c
# Opt level: O0

_Bool test_without_epoxy(void)

{
  glBegin(4);
  (*_epoxy_glVertex4f)(0,0,0);
  (*_epoxy_glMultiTexCoord3f)(0,0,0x84c0);
  if ((has_argb2101010 & 1U) != 0) {
    (*_epoxy_glTexCoordP3ui)(0x8368,0);
  }
  glEnd();
  return true;
}

Assistant:

static bool
test_without_epoxy(void)
{
    glBegin(GL_TRIANGLES);
    {
        /* Hit a base entrypoint that won't call gl_version() */
        glVertex4f(0, 0, 0, 0);

        /* Hit an entrypoint that will call probably call gl_version() */
        glMultiTexCoord3f(GL_TEXTURE0, 0.0, 0.0, 0.0);

        /* Hit an entrypoint that will probably call
         * epoxy_conservative_has_extension();
         */
        if (has_argb2101010) {
            glTexCoordP3ui(GL_UNSIGNED_INT_2_10_10_10_REV, 0);
        }
    }
    glEnd();

    /* We can't make any assertions about error presence this time
     * around. This test is just trying to catch segfaults.
     */
    return true;
}